

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O2

void test_open_address_hashmap_compute_simple_hash(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_hash_t iVar3;
  int iVar4;
  int local_6c;
  ion_hashmap_t map;
  
  initialize_hash_map_std_conditions(&map);
  for (local_6c = 0; local_6c < 100; local_6c = local_6c + 1) {
    iVar4 = local_6c % map.map_size;
    iVar3 = oah_compute_simple_hash(&map,&local_6c,4);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar4 == iVar3),0x8d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_0010158e;
  }
  iVar2 = oah_destroy(&map);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2 == '\0'),0x90,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    return;
  }
LAB_0010158e:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_compute_simple_hash(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;		/* create handler for hashmap */
	int				i;

	initialize_hash_map_std_conditions(&map);

	for (i = 0; i < ION_MAX_HASH_TEST; i++) {
		PLANCK_UNIT_ASSERT_TRUE(tc, (i % map.map_size) == oah_compute_simple_hash(&map, ((int *) &i), sizeof(i)));
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}